

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall FIX::double_conversion::Bignum::SubtractTimes(Bignum *this,Bignum *other,int factor)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  int local_48;
  Chunk difference_1;
  int i_2;
  Chunk difference;
  DoubleChunk remove;
  DoubleChunk product;
  int i_1;
  int exponent_diff;
  Chunk borrow;
  int i;
  int factor_local;
  Bignum *other_local;
  Bignum *this_local;
  
  if (other->exponent_ < this->exponent_) {
    __assert_fail("exponent_ <= other.exponent_",
                  "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/bignum.cc"
                  ,0x2e3,"void FIX::double_conversion::Bignum::SubtractTimes(const Bignum &, int)");
  }
  if (factor < 3) {
    for (exponent_diff = 0; exponent_diff < factor; exponent_diff = exponent_diff + 1) {
      SubtractBignum(this,other);
    }
  }
  else {
    i_1 = 0;
    local_48 = other->exponent_ - this->exponent_;
    for (product._4_4_ = 0; product._4_4_ < other->used_digits_; product._4_4_ = product._4_4_ + 1)
    {
      puVar2 = Vector<unsigned_int>::operator[](&other->bigits_,product._4_4_);
      uVar3 = (ulong)(uint)i_1 + (long)factor * (ulong)*puVar2;
      puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,product._4_4_ + local_48);
      uVar1 = *puVar2 - ((uint)uVar3 & 0xfffffff);
      puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,product._4_4_ + local_48);
      *puVar2 = uVar1 & 0xfffffff;
      i_1 = (int)(uVar3 >> 0x1c) - ((int)uVar1 >> 0x1f);
    }
    for (local_48 = other->used_digits_ + local_48; local_48 < this->used_digits_;
        local_48 = local_48 + 1) {
      if (i_1 == 0) {
        return;
      }
      puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,local_48);
      uVar1 = *puVar2;
      puVar2 = Vector<unsigned_int>::operator[](&this->bigits_,local_48);
      *puVar2 = uVar1 - i_1 & 0xfffffff;
      i_1 = uVar1 - i_1 >> 0x1f;
    }
    Clamp(this);
  }
  return;
}

Assistant:

void Bignum::SubtractTimes(const Bignum& other, int factor) {
  ASSERT(exponent_ <= other.exponent_);
  if (factor < 3) {
    for (int i = 0; i < factor; ++i) {
      SubtractBignum(other);
    }
    return;
  }
  Chunk borrow = 0;
  int exponent_diff = other.exponent_ - exponent_;
  for (int i = 0; i < other.used_digits_; ++i) {
    DoubleChunk product = static_cast<DoubleChunk>(factor) * other.bigits_[i];
    DoubleChunk remove = borrow + product;
    Chunk difference = bigits_[i + exponent_diff] - (remove & kBigitMask);
    bigits_[i + exponent_diff] = difference & kBigitMask;
    borrow = static_cast<Chunk>((difference >> (kChunkSize - 1)) +
                                (remove >> kBigitSize));
  }
  for (int i = other.used_digits_ + exponent_diff; i < used_digits_; ++i) {
    if (borrow == 0) return;
    Chunk difference = bigits_[i] - borrow;
    bigits_[i] = difference & kBigitMask;
    borrow = difference >> (kChunkSize - 1);
  }
  Clamp();
}